

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocument.cpp
# Opt level: O2

vector<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_> *
__thiscall Assimp::FBX::Document::AnimationStacks(Document *this)

{
  vector<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_>
  *this_00;
  pointer puVar1;
  pointer puVar2;
  uint64_t *puVar3;
  LazyObject *this_01;
  uint64_t *puVar4;
  AnimationStack *stack;
  allocator<char> local_59;
  AnimationStack *local_58;
  string local_50;
  
  this_00 = &this->animationStacksResolved;
  if ((this->animationStacksResolved).
      super__Vector_base<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->animationStacksResolved).
      super__Vector_base<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    puVar1 = (this->animationStacks).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (this->animationStacks).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar1 != puVar2) {
      std::
      vector<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_>
      ::reserve(this_00,(long)puVar2 - (long)puVar1 >> 3);
      puVar3 = (this->animationStacks).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (puVar4 = (this->animationStacks).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start; puVar4 != puVar3; puVar4 = puVar4 + 1) {
        this_01 = GetObject(this,*puVar4);
        if (this_01 == (LazyObject *)0x0) {
LAB_005275b5:
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,"failed to read AnimationStack object",&local_59);
          Util::DOMWarning(&local_50,(Element *)0x0);
          std::__cxx11::string::~string((string *)&local_50);
        }
        else {
          local_58 = LazyObject::Get<Assimp::FBX::AnimationStack>(this_01,false);
          if (local_58 == (AnimationStack *)0x0) goto LAB_005275b5;
          std::
          vector<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_>
          ::push_back(this_00,&local_58);
        }
      }
    }
  }
  return this_00;
}

Assistant:

const std::vector<const AnimationStack*>& Document::AnimationStacks() const
{
    if (!animationStacksResolved.empty() || animationStacks.empty()) {
        return animationStacksResolved;
    }

    animationStacksResolved.reserve(animationStacks.size());
    for(uint64_t id : animationStacks) {
        LazyObject* const lazy = GetObject(id);
        const AnimationStack* stack;
        if(!lazy || !(stack = lazy->Get<AnimationStack>())) {
            DOMWarning("failed to read AnimationStack object");
            continue;
        }
        animationStacksResolved.push_back(stack);
    }

    return animationStacksResolved;
}